

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devicehandlerlist_p.h
# Opt level: O3

void __thiscall
QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::add
          (DeviceHandlerList<QEvdevTabletHandlerThread> *this,QString *deviceNode,
          unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
          handler)

{
  long in_FS_OFFSET;
  Device local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.deviceNode.d.d = (deviceNode->d).d;
  local_30.deviceNode.d.ptr = (deviceNode->d).ptr;
  local_30.deviceNode.d.size = (deviceNode->d).size;
  if (&(local_30.deviceNode.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_30.deviceNode.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_30.deviceNode.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30.handler._M_t.
  super___uniq_ptr_impl<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>.
  _M_t.
  super__Tuple_impl<0UL,_QEvdevTabletHandlerThread_*,_std::default_delete<QEvdevTabletHandlerThread>_>
  .super__Head_base<0UL,_QEvdevTabletHandlerThread_*,_false>._M_head_impl =
       *(__uniq_ptr_data<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>,_true,_true>
         *)handler._M_t.
           super___uniq_ptr_impl<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
           ._M_t.
           super__Tuple_impl<0UL,_QEvdevTabletHandlerThread_*,_std::default_delete<QEvdevTabletHandlerThread>_>
           .super__Head_base<0UL,_QEvdevTabletHandlerThread_*,_false>._M_head_impl;
  *(undefined8 *)
   handler._M_t.
   super___uniq_ptr_impl<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
   ._M_t.
   super__Tuple_impl<0UL,_QEvdevTabletHandlerThread_*,_std::default_delete<QEvdevTabletHandlerThread>_>
   .super__Head_base<0UL,_QEvdevTabletHandlerThread_*,_false>._M_head_impl = 0;
  std::
  vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
  ::emplace_back<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>
            (&this->v,&local_30);
  if ((_Tuple_impl<0UL,_QEvdevTabletHandlerThread_*,_std::default_delete<QEvdevTabletHandlerThread>_>
       )local_30.handler._M_t.
        super___uniq_ptr_impl<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
        ._M_t.
        super__Tuple_impl<0UL,_QEvdevTabletHandlerThread_*,_std::default_delete<QEvdevTabletHandlerThread>_>
        .super__Head_base<0UL,_QEvdevTabletHandlerThread_*,_false>._M_head_impl !=
      (QEvdevTabletHandlerThread *)0x0) {
    (**(code **)(*(long *)local_30.handler._M_t.
                          super___uniq_ptr_impl<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QEvdevTabletHandlerThread_*,_std::default_delete<QEvdevTabletHandlerThread>_>
                          .super__Head_base<0UL,_QEvdevTabletHandlerThread_*,_false>._M_head_impl +
                0x20))();
  }
  local_30.handler._M_t.
  super___uniq_ptr_impl<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>.
  _M_t.
  super__Tuple_impl<0UL,_QEvdevTabletHandlerThread_*,_std::default_delete<QEvdevTabletHandlerThread>_>
  .super__Head_base<0UL,_QEvdevTabletHandlerThread_*,_false>._M_head_impl =
       (__uniq_ptr_data<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>,_true,_true>
        )(__uniq_ptr_impl<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
          )0x0;
  if (&(local_30.deviceNode.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.deviceNode.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.deviceNode.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_30.deviceNode.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_30.deviceNode.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void add(const QString &deviceNode, std::unique_ptr<Handler> handler)
    {
        v.push_back({deviceNode, std::move(handler)});
    }